

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O0

int get_video_args(char **argv,int *w,int *h,int *bpp,Uint32 *flags)

{
  int iVar1;
  int local_34;
  int i;
  Uint32 *flags_local;
  int *bpp_local;
  int *h_local;
  int *w_local;
  char **argv_local;
  
  *w = 0x280;
  *h = 0x1e0;
  *bpp = 0;
  *flags = 0;
  local_34 = 1;
  do {
    if (argv[local_34] == (char *)0x0) {
      return local_34;
    }
    iVar1 = strcmp(argv[local_34],"-width");
    if (iVar1 == 0) {
      if (argv[local_34 + 1] != (char *)0x0) {
        local_34 = local_34 + 1;
        iVar1 = atoi(argv[local_34]);
        *w = iVar1;
      }
    }
    else {
      iVar1 = strcmp(argv[local_34],"-height");
      if (iVar1 == 0) {
        if (argv[local_34 + 1] != (char *)0x0) {
          local_34 = local_34 + 1;
          iVar1 = atoi(argv[local_34]);
          *h = iVar1;
        }
      }
      else {
        iVar1 = strcmp(argv[local_34],"-bpp");
        if (iVar1 == 0) {
          if (argv[local_34 + 1] != (char *)0x0) {
            local_34 = local_34 + 1;
            iVar1 = atoi(argv[local_34]);
            *bpp = iVar1;
          }
        }
        else {
          iVar1 = strcmp(argv[local_34],"-fullscreen");
          if (iVar1 == 0) {
            *flags = *flags | 0x80000000;
          }
          else {
            iVar1 = strcmp(argv[local_34],"-hw");
            if (iVar1 == 0) {
              *flags = *flags | 1;
            }
            else {
              iVar1 = strcmp(argv[local_34],"-hwpalette");
              if (iVar1 != 0) {
                return local_34;
              }
              *flags = *flags | 0x20000000;
            }
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int get_video_args(char *argv[], int *w, int *h, int *bpp, Uint32 *flags)
{
	int i;

	*w = 640;
	*h = 480;
	*bpp = 0;
	*flags = SDL_SWSURFACE;

	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-width") == 0 ) {
			if ( argv[i+1] ) {
				*w = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-height") == 0 ) {
			if ( argv[i+1] ) {
				*h = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-bpp") == 0 ) {
			if ( argv[i+1] ) {
				*bpp = atoi(argv[++i]);
			}
		} else
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			*flags |= SDL_FULLSCREEN;
		} else
		if ( strcmp(argv[i], "-hw") == 0 ) {
			*flags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[i], "-hwpalette") == 0 ) {
			*flags |= SDL_HWPALETTE;
		} else
			break;
	}
	return i;
}